

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBoolean.cpp
# Opt level: O3

Var Js::JavascriptBoolean::EntryValueOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  BOOL value;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptBoolean *aValue;
  JavascriptBooleanObject *this_00;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBoolean.cpp"
                                ,0x44,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb1f1d;
    *puVar4 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBoolean.cpp"
                                ,0x47,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bb1f1d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar3 = VarIs<Js::JavascriptBoolean>(pvVar5);
  aValue = (JavascriptBoolean *)Arguments::operator[]((Arguments *)&callInfo_local,0);
  if (!bVar3) {
    bVar3 = VarIs<Js::JavascriptBooleanObject>(aValue);
    if (bVar3) {
      pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      this_00 = VarTo<Js::JavascriptBooleanObject>(pvVar5);
      this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
      value = JavascriptBooleanObject::GetValue(this_00);
      aValue = JavascriptLibrary::CreateBoolean(this,value);
    }
    else {
      aValue = (JavascriptBoolean *)
               TryInvokeRemotelyOrThrow
                         (EntryValueOf,pSVar1,(Arguments *)&callInfo_local,-0x7ff5ec3e,
                          L"Boolean.prototype.valueOf");
    }
  }
  return aValue;
}

Assistant:

Var JavascriptBoolean::EntryValueOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if(VarIs<JavascriptBoolean>(args[0]))
        {
            return args[0];
        }
        else if (VarIs<JavascriptBooleanObject>(args[0]))
        {
            JavascriptBooleanObject* booleanObject = VarTo<JavascriptBooleanObject>(args[0]);
            return scriptContext->GetLibrary()->CreateBoolean(booleanObject->GetValue());
        }
        else
        {
            return TryInvokeRemotelyOrThrow(EntryValueOf, scriptContext, args, JSERR_This_NeedBoolean, _u("Boolean.prototype.valueOf"));
        }
    }